

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolve.hpp
# Opt level: O2

bool __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::performSolutionPolishing
          (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this)

{
  Status **ppSVar1;
  uint *puVar2;
  uint n;
  uint n_00;
  int iVar3;
  ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
  *pCVar4;
  Status *pSVar5;
  pointer pnVar6;
  bool bVar7;
  bool bVar8;
  Status SVar9;
  int iVar10;
  SPxOut *pSVar11;
  Status **ppSVar12;
  int i_1;
  long lVar13;
  int iVar14;
  int i;
  ulong uVar15;
  ulong uVar16;
  int i_2;
  long lVar17;
  ulong uVar18;
  undefined1 local_539;
  SPxId polishId;
  int local_524;
  Verbosity old_verbosity;
  uint uStack_51c;
  uint uStack_518;
  uint uStack_514;
  uint local_510;
  uint uStack_50c;
  uint uStack_508;
  uint uStack_504;
  uint local_500 [2];
  int local_4f8;
  bool local_4f4;
  fpclass_type local_4f0;
  int32_t iStack_4ec;
  Status **local_4e8;
  ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
  *local_4e0;
  DIdxSet continuousvars;
  uint local_4b8 [2];
  uint auStack_4b0 [2];
  uint local_4a8;
  uint uStack_4a4;
  uint uStack_4a0;
  uint uStack_49c;
  uint local_498 [8];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_478;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_438;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3f8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  origval;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_310;
  cpp_dec_float<50U,_int,_void> local_2d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2a0;
  cpp_dec_float<50U,_int,_void> local_268;
  cpp_dec_float<50U,_int,_void> local_230;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1f8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_180;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_148;
  cpp_dec_float<50U,_int,_void> local_110;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  cpp_dec_float<50U,_int,_void> local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  if (((-1 < this->maxIters) &&
      (this->maxIters <=
       (this->
       super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).iterCount)) && (bVar7 = isTimeLimitReached(this,false), !bVar7)) {
    return false;
  }
  if ((this->polishObj == POLISH_OFF) || (SVar9 = status(this), SVar9 != OPTIMAL)) {
    bVar7 = false;
  }
  else {
    pCVar4 = (ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
              *)(this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.rowstat.data;
    pSVar5 = (this->
             super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thedesc.colstat.data;
    polishId.super_DataKey.info = 0;
    polishId.super_DataKey.idx = -1;
    (*(this->
      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x5e])(&origval,this);
    pSVar11 = this->spxout;
    if ((pSVar11 != (SPxOut *)0x0) && (3 < (int)pSVar11->m_verbosity)) {
      continuousvars.super_IdxSet._vptr_IdxSet._0_4_ = 4;
      old_verbosity = pSVar11->m_verbosity;
      (*pSVar11->_vptr_SPxOut[2])();
      pSVar11 = soplex::operator<<(this->spxout," --- perform solution polishing");
      std::endl<char,std::char_traits<char>>(pSVar11->m_streams[pSVar11->m_verbosity]);
      (*this->spxout->_vptr_SPxOut[2])(this->spxout,&old_verbosity);
    }
    if (this->theRep == COLUMN) {
      local_4e0 = pCVar4;
      setType(this,ENTER);
      (*(this->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x76])(this);
      entertol((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&old_verbosity,this);
      local_498[0] = local_500[0];
      local_498[1] = local_500[1];
      local_4b8[1] = uStack_51c;
      local_4b8[0] = old_verbosity;
      auStack_4b0[1] = uStack_514;
      auStack_4b0[0] = uStack_518;
      local_4a8 = local_510;
      uStack_4a4 = uStack_50c;
      uStack_4a0 = uStack_508;
      uStack_49c = uStack_504;
      local_498[4] = local_4f0;
      local_498[5] = iStack_4ec;
      this->instableEnter = false;
      (*this->theratiotester->_vptr_SPxRatioTester[9])
                (this->theratiotester,(ulong)(uint)this->theType);
      local_524 = local_4f8;
      local_539 = local_4f4;
      if (this->polishObj == POLISH_INTEGRALITY) {
        n = (this->
            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.thenum;
        n_00 = (this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum;
        DIdxSet::DIdxSet((DIdxSet *)&old_verbosity,n);
        local_4e8 = (Status **)(ulong)n_00;
        DIdxSet::DIdxSet(&continuousvars,n_00);
        pCVar4 = local_4e0;
        uVar15 = 0;
        if ((int)n < 1) {
          n = 0;
        }
        lVar13 = 0x30;
        for (; n != uVar15; uVar15 = uVar15 + 1) {
          if ((*(uint *)((long)&pCVar4->theitem + uVar15 * 4) | 2) == 0xfffffffe) {
            pnVar6 = (this->theCoPvec->
                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_3f8.m_backend.data._M_elems._32_8_ =
                 *(undefined8 *)((long)(pnVar6->m_backend).data._M_elems + lVar13 + -0x10);
            puVar2 = (uint *)((long)(pnVar6->m_backend).data._M_elems + lVar13 + -0x30);
            local_3f8.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar2;
            local_3f8.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
            puVar2 = (uint *)((long)(pnVar6->m_backend).data._M_elems + lVar13 + -0x20);
            local_3f8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
            local_3f8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
            local_3f8.m_backend.exp =
                 *(int *)((long)(pnVar6->m_backend).data._M_elems + lVar13 + -8);
            local_3f8.m_backend.neg =
                 *(bool *)((long)(pnVar6->m_backend).data._M_elems + lVar13 + -4);
            local_3f8.m_backend._48_8_ =
                 *(undefined8 *)((long)(pnVar6->m_backend).data._M_elems + lVar13);
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                      (&local_230,0,(type *)0x0);
            epsilon(&local_68,this);
            bVar7 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                              (&local_3f8,
                               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&local_230,&local_68);
            if (bVar7) {
              DIdxSet::addIdx((DIdxSet *)&old_verbosity,(int)uVar15);
            }
          }
          lVar13 = lVar13 + 0x38;
        }
        if ((this->integerVariables).thesize == (int)local_4e8) {
          uVar18 = 0;
          uVar15 = (ulong)local_4e8 & 0xffffffff;
          if ((int)local_4e8 < 1) {
            uVar15 = uVar18;
          }
          for (uVar16 = 0; uVar15 != uVar16; uVar16 = uVar16 + 1) {
            if ((pSVar5[uVar16] | D_ON_UPPER) == P_ON_UPPER) {
              result.m_backend.fpclass = cpp_dec_float_finite;
              result.m_backend.prec_elem = 10;
              result.m_backend.data._M_elems[0] = 0;
              result.m_backend.data._M_elems[1] = 0;
              result.m_backend.data._M_elems[2] = 0;
              result.m_backend.data._M_elems[3] = 0;
              result.m_backend.data._M_elems[4] = 0;
              result.m_backend.data._M_elems[5] = 0;
              result.m_backend.data._M_elems._24_5_ = 0;
              result.m_backend.data._M_elems[7]._1_3_ = 0;
              result.m_backend.data._M_elems._32_5_ = 0;
              result.m_backend._37_8_ = 0;
              boost::multiprecision::default_ops::
              eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                        (&result.m_backend,
                         (cpp_dec_float<50U,_int,_void> *)
                         ((long)(((this->
                                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ).
                                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  .object.val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                                _M_elems + uVar18),
                         (cpp_dec_float<50U,_int,_void> *)
                         ((long)(((this->thePvec->
                                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ).val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                                _M_elems + uVar18));
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
              cpp_dec_float<long_long>(&local_a0,0,(type *)0x0);
              epsilon(&local_d8,this);
              bVar7 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                (&result,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)&local_a0,&local_d8);
              if ((bVar7) && ((this->integerVariables).data[uVar16] == 0)) {
                DIdxSet::addIdx(&continuousvars,(int)uVar16);
              }
            }
            uVar18 = uVar18 + 0x38;
          }
        }
        bVar7 = false;
        while (!bVar7) {
          uVar15 = (ulong)uStack_518;
          iVar14 = 0;
          while ((0 < (int)uVar15 && (!bVar7))) {
            polishId = coId(this,*(int *)(CONCAT44(uStack_50c,local_510) + -4 + uVar15 * 4));
            bVar8 = enter(this,&polishId,true);
            (*(this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._vptr_ClassArray[0x88])(this);
            if (bVar8) {
              iVar14 = iVar14 + 1;
              lVar13 = (long)(int)uStack_518;
              uStack_518 = uStack_518 - 1;
              *(undefined4 *)(CONCAT44(uStack_50c,local_510) + -4 + uVar15 * 4) =
                   *(undefined4 *)(CONCAT44(uStack_50c,local_510) + -4 + lVar13 * 4);
              if ((-1 < this->maxIters) &&
                 (this->maxIters <=
                  (this->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).iterCount)) {
                bVar7 = true;
              }
            }
            bVar8 = isTimeLimitReached(this,false);
            if (bVar8) {
              bVar7 = true;
            }
            uVar15 = uVar15 - 1;
          }
          uVar15 = (ulong)(uint)continuousvars.super_IdxSet.num;
          while ((0 < (int)uVar15 && (!bVar7))) {
            polishId = id(this,continuousvars.super_IdxSet.idx[uVar15 - 1]);
            bVar8 = enter(this,&polishId,true);
            (*(this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._vptr_ClassArray[0x88])(this);
            if (bVar8) {
              iVar14 = iVar14 + 1;
              lVar13 = (long)continuousvars.super_IdxSet.num;
              continuousvars.super_IdxSet.num = continuousvars.super_IdxSet.num + -1;
              continuousvars.super_IdxSet.idx[uVar15 - 1] =
                   continuousvars.super_IdxSet.idx[lVar13 + -1];
              if ((-1 < this->maxIters) &&
                 (this->maxIters <=
                  (this->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).iterCount)) {
                bVar7 = true;
              }
            }
            bVar8 = isTimeLimitReached(this,false);
            if (bVar8) {
              bVar7 = true;
            }
            uVar15 = uVar15 - 1;
          }
          if (iVar14 == 0) {
            bVar7 = true;
          }
          this->polishCount = this->polishCount + iVar14;
        }
        DIdxSet::~DIdxSet(&continuousvars);
      }
      else {
        DIdxSet::DIdxSet((DIdxSet *)&old_verbosity,(this->thecovectors->set).thenum);
        lVar17 = 0;
        for (lVar13 = 0;
            lVar13 < (this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.thenum; lVar13 = lVar13 + 1) {
          if ((pSVar5[lVar13] | D_ON_UPPER) == P_ON_UPPER) {
            result_1.m_backend.fpclass = cpp_dec_float_finite;
            result_1.m_backend.prec_elem = 10;
            result_1.m_backend.data._M_elems[0] = 0;
            result_1.m_backend.data._M_elems[1] = 0;
            result_1.m_backend.data._M_elems[2] = 0;
            result_1.m_backend.data._M_elems[3] = 0;
            result_1.m_backend.data._M_elems[4] = 0;
            result_1.m_backend.data._M_elems[5] = 0;
            result_1.m_backend.data._M_elems._24_5_ = 0;
            result_1.m_backend.data._M_elems[7]._1_3_ = 0;
            result_1.m_backend.data._M_elems._32_5_ = 0;
            result_1.m_backend._37_8_ = 0;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&result_1.m_backend,
                       (cpp_dec_float<50U,_int,_void> *)
                       ((long)(((this->
                                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).
                                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .object.val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems
                       + lVar17),
                       (cpp_dec_float<50U,_int,_void> *)
                       ((long)(((this->thePvec->
                                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems
                       + lVar17));
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                      (&local_110,0,(type *)0x0);
            epsilon(&local_148,this);
            bVar7 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                              (&result_1,
                               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&local_110,&local_148);
            if (bVar7) {
              DIdxSet::addIdx((DIdxSet *)&old_verbosity,(int)lVar13);
            }
          }
          lVar17 = lVar17 + 0x38;
        }
        bVar7 = false;
        while (!bVar7) {
          uVar15 = (ulong)uStack_518;
          iVar14 = 0;
          while ((0 < (int)uVar15 && (!bVar7))) {
            polishId = id(this,*(int *)(CONCAT44(uStack_50c,local_510) + -4 + uVar15 * 4));
            bVar8 = enter(this,&polishId,true);
            (*(this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._vptr_ClassArray[0x88])(this);
            if (bVar8) {
              iVar14 = iVar14 + 1;
              lVar13 = (long)(int)uStack_518;
              uStack_518 = uStack_518 - 1;
              *(undefined4 *)(CONCAT44(uStack_50c,local_510) + -4 + uVar15 * 4) =
                   *(undefined4 *)(CONCAT44(uStack_50c,local_510) + -4 + lVar13 * 4);
              if ((-1 < this->maxIters) &&
                 (this->maxIters <=
                  (this->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).iterCount)) {
                bVar7 = true;
              }
            }
            bVar8 = isTimeLimitReached(this,false);
            if (bVar8) {
              bVar7 = true;
            }
            uVar15 = uVar15 - 1;
          }
          if (iVar14 == 0) {
            bVar7 = true;
          }
          this->polishCount = this->polishCount + iVar14;
        }
      }
    }
    else {
      ppSVar1 = &(this->
                 super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).thedesc.colstat.data;
      setType(this,LEAVE);
      (*(this->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x76])(this);
      leavetol((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&old_verbosity,this);
      local_498[0] = local_500[0];
      local_498[1] = local_500[1];
      local_4b8[1] = uStack_51c;
      local_4b8[0] = old_verbosity;
      auStack_4b0[1] = uStack_514;
      auStack_4b0[0] = uStack_518;
      local_4a8 = local_510;
      uStack_4a4 = uStack_50c;
      uStack_4a0 = uStack_508;
      uStack_49c = uStack_504;
      local_524 = local_4f8;
      local_539 = local_4f4;
      local_498[4] = local_4f0;
      local_498[5] = iStack_4ec;
      this->instableLeave = false;
      (*this->theratiotester->_vptr_SPxRatioTester[9])
                (this->theratiotester,(ulong)(uint)this->theType);
      iVar14 = (this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum;
      iVar3 = (this->integerVariables).thesize;
      local_4e0 = &(this->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set;
      if (this->polishObj == POLISH_INTEGRALITY) {
        local_4e8 = &(this->
                     super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).thedesc.rowstat.data;
        DIdxSet::DIdxSet((DIdxSet *)&old_verbosity,(this->thecovectors->set).thenum);
        lVar13 = 6;
        for (lVar17 = 0; lVar17 < (this->thecovectors->set).thenum; lVar17 = lVar17 + 1) {
          polishId.super_DataKey =
               (this->
               super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).theBaseId.data[lVar17].super_DataKey;
          if (polishId.super_DataKey.info < 0) {
            iVar10 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::number(&this->
                               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ,&polishId);
            ppSVar12 = local_4e8;
LAB_0020a3f7:
            if (((*ppSVar12)[iVar10] & (P_ON_LOWER|D_FREE)) == P_ON_LOWER) {
              pnVar6 = (this->theFvec->
                       super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_438.m_backend.data._M_elems._32_8_ =
                   *(undefined8 *)
                    ((pnVar6->m_backend).data._M_elems + lVar13 * 2U + 0xfffffffffffffffc);
              puVar2 = (pnVar6->m_backend).data._M_elems + lVar13 * 2U + 0xfffffffffffffff4;
              local_438.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar2;
              local_438.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
              puVar2 = (pnVar6->m_backend).data._M_elems + lVar13 * 2U + 0xfffffffffffffff8;
              local_438.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
              local_438.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
              local_438.m_backend.exp =
                   (pnVar6->m_backend).data._M_elems[lVar13 * 2U + 0xfffffffffffffffe];
              local_438.m_backend.neg =
                   SUB41((pnVar6->m_backend).data._M_elems[lVar13 * 2U + 0xffffffffffffffff],0);
              local_438.m_backend._48_8_ =
                   *(undefined8 *)((pnVar6->m_backend).data._M_elems + lVar13 * 2);
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
              cpp_dec_float<long_long>(&local_268,0,(type *)0x0);
              epsilon(&local_2a0,this);
              bVar7 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                (&local_438,
                                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)&local_268,&local_2a0);
              if (bVar7) {
                DIdxSet::addIdx((DIdxSet *)&old_verbosity,(int)lVar17);
              }
            }
          }
          else if (iVar3 == iVar14) {
            SPxColId::SPxColId((SPxColId *)&continuousvars,&polishId);
            iVar10 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                     ::number(local_4e0,(DataKey *)&continuousvars);
            if ((this->integerVariables).data[iVar10] != 1) {
              iVar10 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ::number(&this->
                                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ,&polishId);
              ppSVar12 = ppSVar1;
              goto LAB_0020a3f7;
            }
          }
          lVar13 = lVar13 + 7;
        }
        bVar7 = false;
        while (!bVar7) {
          uVar15 = (ulong)uStack_518;
          iVar14 = 0;
          while ((0 < (int)uVar15 && (!bVar7))) {
            bVar8 = leave(this,*(int *)(CONCAT44(uStack_50c,local_510) + -4 + uVar15 * 4),true);
            (*(this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._vptr_ClassArray[0x88])(this);
            if (bVar8) {
              iVar14 = iVar14 + 1;
              lVar13 = (long)(int)uStack_518;
              uStack_518 = uStack_518 - 1;
              *(undefined4 *)(CONCAT44(uStack_50c,local_510) + -4 + uVar15 * 4) =
                   *(undefined4 *)(CONCAT44(uStack_50c,local_510) + -4 + lVar13 * 4);
              if ((-1 < this->maxIters) &&
                 (this->maxIters <=
                  (this->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).iterCount)) {
                bVar7 = true;
              }
            }
            bVar8 = isTimeLimitReached(this,false);
            if (bVar8) {
              bVar7 = true;
            }
            uVar15 = uVar15 - 1;
          }
          if (iVar14 == 0) {
            bVar7 = true;
          }
          this->polishCount = this->polishCount + iVar14;
        }
      }
      else {
        lVar13 = 6;
        DIdxSet::DIdxSet((DIdxSet *)&old_verbosity,(this->thecovectors->set).thenum);
        for (lVar17 = 0; lVar17 < (this->thecovectors->set).thenum; lVar17 = lVar17 + 1) {
          polishId.super_DataKey =
               (this->
               super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).theBaseId.data[lVar17].super_DataKey;
          if (-1 < polishId.super_DataKey.info) {
            if (iVar3 == iVar14) {
              SPxColId::SPxColId((SPxColId *)&continuousvars,&polishId);
              iVar10 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                       ::number(local_4e0,(DataKey *)&continuousvars);
              if ((this->integerVariables).data[iVar10] == 0) goto LAB_0020a6e1;
            }
            if (((*ppSVar1)[lVar17] & (P_ON_LOWER|D_FREE)) == P_ON_LOWER) {
              pnVar6 = (this->theFvec->
                       super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_478.m_backend.data._M_elems._32_8_ =
                   *(undefined8 *)
                    ((pnVar6->m_backend).data._M_elems + lVar13 * 2U + 0xfffffffffffffffc);
              puVar2 = (pnVar6->m_backend).data._M_elems + lVar13 * 2U + 0xfffffffffffffff4;
              local_478.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar2;
              local_478.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
              puVar2 = (pnVar6->m_backend).data._M_elems + lVar13 * 2U + 0xfffffffffffffff8;
              local_478.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
              local_478.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
              local_478.m_backend.exp =
                   (pnVar6->m_backend).data._M_elems[lVar13 * 2U + 0xfffffffffffffffe];
              local_478.m_backend.neg =
                   SUB41((pnVar6->m_backend).data._M_elems[lVar13 * 2U + 0xffffffffffffffff],0);
              local_478.m_backend._48_8_ =
                   *(undefined8 *)((pnVar6->m_backend).data._M_elems + lVar13 * 2);
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
              cpp_dec_float<long_long>(&local_2d8,0,(type *)0x0);
              epsilon(&local_310,this);
              bVar7 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                (&local_478,
                                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)&local_2d8,&local_310);
              if (bVar7) {
                DIdxSet::addIdx((DIdxSet *)&old_verbosity,(int)lVar17);
              }
            }
          }
LAB_0020a6e1:
          lVar13 = lVar13 + 7;
        }
        bVar7 = false;
        while (!bVar7) {
          uVar15 = (ulong)uStack_518;
          iVar14 = 0;
          while ((0 < (int)uVar15 && (!bVar7))) {
            bVar8 = leave(this,*(int *)(CONCAT44(uStack_50c,local_510) + -4 + uVar15 * 4),true);
            (*(this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._vptr_ClassArray[0x88])(this);
            if (bVar8) {
              iVar14 = iVar14 + 1;
              lVar13 = (long)(int)uStack_518;
              uStack_518 = uStack_518 - 1;
              *(undefined4 *)(CONCAT44(uStack_50c,local_510) + -4 + uVar15 * 4) =
                   *(undefined4 *)(CONCAT44(uStack_50c,local_510) + -4 + lVar13 * 4);
              if ((-1 < this->maxIters) &&
                 (this->maxIters <=
                  (this->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).iterCount)) {
                bVar7 = true;
              }
            }
            bVar8 = isTimeLimitReached(this,false);
            if (bVar8) {
              bVar7 = true;
            }
            uVar15 = uVar15 - 1;
          }
          if (iVar14 == 0) {
            bVar7 = true;
          }
          this->polishCount = this->polishCount + iVar14;
        }
      }
    }
    DIdxSet::~DIdxSet((DIdxSet *)&old_verbosity);
    pSVar11 = this->spxout;
    if ((pSVar11 != (SPxOut *)0x0) && (2 < (int)pSVar11->m_verbosity)) {
      continuousvars.super_IdxSet._vptr_IdxSet._0_4_ = 3;
      old_verbosity = pSVar11->m_verbosity;
      (*pSVar11->_vptr_SPxOut[2])();
      pSVar11 = soplex::operator<<(this->spxout," --- finished solution polishing (");
      pSVar11 = soplex::operator<<(pSVar11,this->polishCount);
      pSVar11 = soplex::operator<<(pSVar11," pivots)");
      std::endl<char,std::char_traits<char>>(pSVar11->m_streams[pSVar11->m_verbosity]);
      (*this->spxout->_vptr_SPxOut[2])(this->spxout,&old_verbosity);
    }
    if ((this->
        super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).thestatus != OPTIMAL) {
      (this->
      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).thestatus = OPTIMAL;
    }
    (*(this->
      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x5e])(&local_180,this);
    local_1b8.m_backend.data._M_elems[8] = origval.m_backend.data._M_elems[8];
    local_1b8.m_backend.data._M_elems[9] = origval.m_backend.data._M_elems[9];
    local_1b8.m_backend.data._M_elems[4] = origval.m_backend.data._M_elems[4];
    local_1b8.m_backend.data._M_elems[5] = origval.m_backend.data._M_elems[5];
    local_1b8.m_backend.data._M_elems[6] = origval.m_backend.data._M_elems[6];
    local_1b8.m_backend.data._M_elems[7] = origval.m_backend.data._M_elems[7];
    local_1b8.m_backend.data._M_elems[0] = origval.m_backend.data._M_elems[0];
    local_1b8.m_backend.data._M_elems[1] = origval.m_backend.data._M_elems[1];
    local_1b8.m_backend.data._M_elems[2] = origval.m_backend.data._M_elems[2];
    local_1b8.m_backend.data._M_elems[3] = origval.m_backend.data._M_elems[3];
    local_1b8.m_backend.exp = origval.m_backend.exp;
    local_1b8.m_backend.neg = origval.m_backend.neg;
    local_1b8.m_backend.fpclass = origval.m_backend.fpclass;
    local_1b8.m_backend.prec_elem = origval.m_backend.prec_elem;
    local_1f8.m_backend.data._M_elems[5] = uStack_4a4;
    local_1f8.m_backend.data._M_elems[4] = local_4a8;
    local_1f8.m_backend.data._M_elems[7] = uStack_49c;
    local_1f8.m_backend.data._M_elems[6] = uStack_4a0;
    local_1f8.m_backend.data._M_elems[0] = local_4b8[0];
    local_1f8.m_backend.data._M_elems[1] = local_4b8[1];
    local_1f8.m_backend.data._M_elems[2] = auStack_4b0[0];
    local_1f8.m_backend.data._M_elems[3] = auStack_4b0[1];
    local_1f8.m_backend.data._M_elems[8] = local_498[0];
    local_1f8.m_backend.data._M_elems[9] = local_498[1];
    local_1f8.m_backend.exp = local_524;
    local_1f8.m_backend.neg = (bool)local_539;
    local_1f8.m_backend.fpclass = local_498[4];
    local_1f8.m_backend.prec_elem = local_498[5];
    bVar7 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_180,&local_1b8,&local_1f8);
    bVar7 = !bVar7;
  }
  return bVar7;
}

Assistant:

bool SPxSolverBase<R>::performSolutionPolishing()
{
   // catch rare case that the iteration limit is exactly reached at optimality
   bool stop = (maxIters >= 0 && iterations() >= maxIters && !isTimeLimitReached());

   // only polish an already optimal basis
   if(stop || polishObj == POLISH_OFF || status() != OPTIMAL)
      return false;

   int nSuccessfulPivots;
   const typename SPxBasisBase<R>::Desc& ds = this->desc();
   const typename SPxBasisBase<R>::Desc::Status* rowstatus = ds.rowStatus();
   const typename SPxBasisBase<R>::Desc::Status* colstatus = ds.colStatus();
   typename SPxBasisBase<R>::Desc::Status stat;
   SPxId polishId;
   bool success = false;

   R alloweddeviation;
   R origval = value();

   SPX_MSG_INFO2((*this->spxout), (*this->spxout) << " --- perform solution polishing" << std::endl;)

   if(rep() == COLUMN)
   {
      setType(ENTER); // use primal simplex to preserve feasibility
      init();
      alloweddeviation = entertol();

      instableEnter = false;
      theratiotester->setType(type());

      int nrows = this->nRows();
      int ncols = this->nCols();

      assert(nrows >= 0);
      assert(ncols >= 0);

      if(polishObj == POLISH_INTEGRALITY)
      {
         DIdxSet slackcandidates(nrows);
         DIdxSet continuousvars(ncols);

         // collect nonbasic slack variables that could be made basic
         for(int i = 0; i < nrows; ++i)
         {
            // only check nonbasic rows, skip equations
            if(rowstatus[i] ==  SPxBasisBase<R>::Desc::P_ON_LOWER
                  || rowstatus[i] == SPxBasisBase<R>::Desc::P_ON_UPPER)
            {
               // only consider rows with zero dual multiplier to preserve optimality
               if(EQrel((*theCoPvec)[i], (R) 0, this->epsilon()))
                  slackcandidates.addIdx(i);
            }
         }

         // collect continuous variables that could be made basic
         if(integerVariables.size() == ncols)
         {
            for(int i = 0; i < ncols; ++i)
            {
               // skip fixed variables
               if(colstatus[i] == SPxBasisBase<R>::Desc::P_ON_LOWER
                     || colstatus[i] ==  SPxBasisBase<R>::Desc::P_ON_UPPER)
               {
                  // only consider continuous variables with zero dual multiplier to preserve optimality
                  if(EQrel(this->maxObj(i) - (*thePvec)[i], (R) 0, this->epsilon()) && integerVariables[i] == 0)
                     continuousvars.addIdx(i);
               }
            }
         }

         while(!stop)
         {
            nSuccessfulPivots = 0;

            // identify nonbasic slack variables, i.e. rows, that may be moved into the basis
            for(int i = slackcandidates.size() - 1; i >= 0 && !stop; --i)
            {
               // coverity[forward_null]
               polishId = coId(slackcandidates.index(i));
               SPxOut::debug(this, "try pivoting: {} stat: {}\n", polishId, rowstatus[slackcandidates.index(i)]);
               success = enter(polishId, true);
               clearUpdateVecs();

               if(success)
               {
                  SPxOut::debug(this, " -> success!");
                  ++nSuccessfulPivots;
                  slackcandidates.remove(i);

                  if(maxIters >= 0 && iterations() >= maxIters)
                     stop = true;
               }

               SPxOut::debug(this, "\n");

               if(isTimeLimitReached())
                  stop = true;
            }

            // identify nonbasic variables that may be moved into the basis
            for(int i = continuousvars.size() - 1; i >= 0 && !stop; --i)
            {
               polishId = id(continuousvars.index(i));
               SPxOut::debug(this, "try pivoting: {} stat: {}\n", polishId, colstatus[continuousvars.index(i)]);
               success = enter(polishId, true);
               clearUpdateVecs();

               if(success)
               {
                  SPxOut::debug(this, " -> success!");
                  ++nSuccessfulPivots;
                  continuousvars.remove(i);

                  if(maxIters >= 0 && iterations() >= maxIters)
                     stop = true;
               }

               SPxOut::debug(this, "\n");

               if(isTimeLimitReached())
                  stop = true;
            }

            // terminate if in the last round no more polishing steps were performed
            if(nSuccessfulPivots == 0)
               stop = true;

            polishCount += nSuccessfulPivots;
         }
      }
      else
      {
         assert(polishObj == POLISH_FRACTIONALITY);
         assert(dim() >= 0);
         DIdxSet candidates(dim());

         // identify nonbasic variables, i.e. columns, that may be moved into the basis
         for(int i = 0; i < this->nCols() && !stop; ++i)
         {
            if(colstatus[i] == SPxBasisBase<R>::Desc::P_ON_LOWER
                  || colstatus[i] == SPxBasisBase<R>::Desc::P_ON_UPPER)
            {
               // only consider variables with zero reduced costs to preserve optimality
               if(EQrel(this->maxObj(i) - (*thePvec)[i], (R) 0, this->epsilon()))
                  candidates.addIdx(i);
            }
         }

         while(!stop)
         {
            nSuccessfulPivots = 0;

            for(int i = candidates.size() - 1; i >= 0 && !stop; --i)
            {
               // coverity[forward_null]
               polishId = id(candidates.index(i));
               SPxOut::debug(this, "try pivoting: {} stat: {}\n", polishId, colstatus[candidates.index(i)]);
               success = enter(polishId, true);
               clearUpdateVecs();

               if(success)
               {
                  SPxOut::debug(this, " -> success!");
                  ++nSuccessfulPivots;
                  candidates.remove(i);

                  if(maxIters >= 0 && iterations() >= maxIters)
                     stop = true;
               }

               SPxOut::debug(this, "\n");

               if(isTimeLimitReached())
                  stop = true;
            }

            // terminate if in the last round no more polishing steps were performed
            if(nSuccessfulPivots == 0)
               stop = true;

            polishCount += nSuccessfulPivots;
         }
      }
   }
   else
   {
      setType(LEAVE); // use primal simplex to preserve feasibility
      init();
      alloweddeviation = leavetol();
      instableLeave = false;
      theratiotester->setType(type());
      bool useIntegrality = false;
      int ncols = this->nCols();

      if(integerVariables.size() == ncols)
         useIntegrality = true;

      // in ROW rep: pivot slack out of the basis
      if(polishObj == POLISH_INTEGRALITY)
      {
         assert(dim() >= 0);
         DIdxSet basiccandidates(dim());

         // collect basic candidates that may be moved out of the basis
         for(int i = 0; i < dim(); ++i)
         {
            polishId = this->baseId(i);

            if(polishId.isSPxRowId())
               stat = ds.rowStatus(this->number(polishId));
            else
            {
               // skip (integer) variables
               if(!useIntegrality || integerVariables[this->number(SPxColId(polishId))] == 1)
                  continue;

               stat = ds.colStatus(this->number(polishId));
            }

            if(stat == SPxBasisBase<R>::Desc::P_ON_LOWER || stat ==  SPxBasisBase<R>::Desc::P_ON_UPPER)
            {
               if(EQrel((*theFvec)[i], (R) 0, this->epsilon()))
                  basiccandidates.addIdx(i);
            }
         }

         while(!stop)
         {
            nSuccessfulPivots = 0;

            for(int i = basiccandidates.size() - 1; i >= 0 && !stop; --i)
            {
               // coverity[forward_null]
               SPxOut::debug(this, "try pivoting: {}", this->baseId(basiccandidates.index(i)));
               success = leave(basiccandidates.index(i), true);
               clearUpdateVecs();

               if(success)
               {
                  SPxOut::debug(this, " -> success!");
                  ++nSuccessfulPivots;
                  basiccandidates.remove(i);

                  if(maxIters >= 0 && iterations() >= maxIters)
                     stop = true;
               }

               SPxOut::debug(this, "\n");

               if(isTimeLimitReached())
                  stop = true;
            }

            // terminate if in the last round no more polishing steps were performed
            if(nSuccessfulPivots == 0)
               stop = true;

            polishCount += nSuccessfulPivots;
         }
      }
      else
      {
         assert(polishObj == POLISH_FRACTIONALITY);
         assert(dim() >= 0);
         DIdxSet basiccandidates(dim());

         // collect basic (integer) variables, that may be moved out of the basis
         for(int i = 0; i < dim(); ++i)
         {
            polishId = this->baseId(i);

            if(polishId.isSPxRowId())
               continue;
            else
            {
               if(useIntegrality && integerVariables[this->number(SPxColId(polishId))] == 0)
                  continue;

               stat = ds.colStatus(i);
            }

            if(stat == SPxBasisBase<R>::Desc::P_ON_LOWER || stat ==  SPxBasisBase<R>::Desc::P_ON_UPPER)
            {
               if(EQrel((*theFvec)[i], (R) 0, this->epsilon()))
                  basiccandidates.addIdx(i);
            }
         }

         while(!stop)
         {
            nSuccessfulPivots = 0;

            for(int i = basiccandidates.size() - 1; i >= 0 && !stop; --i)
            {
               // coverity[forward_null]
               SPxOut::debug(this, "try pivoting: {}", this->baseId(basiccandidates.index(i)));
               success = leave(basiccandidates.index(i), true);
               clearUpdateVecs();

               if(success)
               {
                  SPxOut::debug(this, " -> success!");
                  ++nSuccessfulPivots;
                  basiccandidates.remove(i);

                  if(maxIters >= 0 && iterations() >= maxIters)
                     stop = true;
               }

               SPxOut::debug(this, "\n");

               if(isTimeLimitReached())
                  stop = true;
            }

            // terminate if in the last round no more polishing steps were performed
            if(nSuccessfulPivots == 0)
               stop = true;

            polishCount += nSuccessfulPivots;
         }
      }
   }

   SPX_MSG_INFO1((*this->spxout),
                 (*this->spxout) << " --- finished solution polishing (" << polishCount << " pivots)" << std::endl;)

   this->setStatus(SPxBasisBase<R>::OPTIMAL);

   // if the value() changed significantly (due to numerics) reoptimize after polishing
   if(!EQrel(value(), origval, alloweddeviation))
      return true;
   else
      return false;
}